

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsRecruiter.cc
# Opt level: O0

ReadThreadsGraph * __thiscall
LongReadsRecruiter::rtg_from_threads
          (LongReadsRecruiter *this,bool remove_duplicated,int min_thread_nodes)

{
  bool bVar1;
  vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
  *this_00;
  reference pNVar2;
  reference pvVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar4;
  ReadThreadsGraph *pRVar5;
  ReadThreadsGraph *pRVar6;
  byte in_DL;
  long *in_RSI;
  size_type __n;
  ReadThreadsGraph *in_RDI;
  int rid;
  uint64_t i;
  NodePosition *np;
  const_iterator __end2;
  const_iterator __begin2;
  vector<NodePosition,_std::allocator<NodePosition>_> *__range2;
  vector<NodePosition,_std::allocator<NodePosition>_> *t;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
  *__range1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> node_counts;
  ReadThreadsGraph *rtg;
  vector<NodePosition,_std::allocator<NodePosition>_> *in_stack_fffffffffffffed8;
  string *in_stack_fffffffffffffee0;
  SequenceDistanceGraph *in_stack_fffffffffffffee8;
  ReadThreadsGraph *in_stack_fffffffffffffef0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  size_type in_stack_fffffffffffffef8;
  vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
  *__new_size;
  undefined1 *__n_00;
  int local_c4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_c0;
  __normal_iterator<const_NodePosition_*,_std::vector<NodePosition,_std::allocator<NodePosition>_>_>
  local_a8;
  reference local_a0;
  reference local_98;
  vector<NodePosition,_std::allocator<NodePosition>_> *local_90;
  __normal_iterator<std::vector<NodePosition,_std::allocator<NodePosition>_>_*,_std::vector<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>_>
  local_88;
  long *local_80;
  undefined1 local_71;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_70;
  allocator local_41;
  string local_40 [39];
  byte local_19;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_19 = 0;
  pRVar5 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"RTG",&local_41);
  ReadThreadsGraph::ReadThreadsGraph
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  this_00 = (vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
             *)std::vector<Node,_std::allocator<Node>_>::size
                         ((vector<Node,_std::allocator<Node>_> *)(*in_RSI + 0x40));
  __n_00 = &local_71;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x4dd68b);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,
             in_stack_fffffffffffffef8,(allocator_type *)in_stack_fffffffffffffef0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x4dd6b1);
  local_80 = in_RSI + 6;
  local_88._M_current =
       (vector<NodePosition,_std::allocator<NodePosition>_> *)
       std::
       vector<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
       ::begin((vector<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
                *)in_stack_fffffffffffffed8);
  local_90 = (vector<NodePosition,_std::allocator<NodePosition>_> *)
             std::
             vector<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
             ::end((vector<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
                    *)in_stack_fffffffffffffed8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::vector<NodePosition,_std::allocator<NodePosition>_>_*,_std::vector<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>_>
                        *)in_stack_fffffffffffffee0,
                       (__normal_iterator<std::vector<NodePosition,_std::allocator<NodePosition>_>_*,_std::vector<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>_>
                        *)in_stack_fffffffffffffed8);
    if (!bVar1) break;
    local_a0 = __gnu_cxx::
               __normal_iterator<std::vector<NodePosition,_std::allocator<NodePosition>_>_*,_std::vector<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>_>
               ::operator*(&local_88);
    local_98 = local_a0;
    local_a8._M_current =
         (NodePosition *)
         std::vector<NodePosition,_std::allocator<NodePosition>_>::begin(in_stack_fffffffffffffed8);
    std::vector<NodePosition,_std::allocator<NodePosition>_>::end(in_stack_fffffffffffffed8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_NodePosition_*,_std::vector<NodePosition,_std::allocator<NodePosition>_>_>
                          *)in_stack_fffffffffffffee0,
                         (__normal_iterator<const_NodePosition_*,_std::vector<NodePosition,_std::allocator<NodePosition>_>_>
                          *)in_stack_fffffffffffffed8);
      if (!bVar1) break;
      pNVar2 = __gnu_cxx::
               __normal_iterator<const_NodePosition_*,_std::vector<NodePosition,_std::allocator<NodePosition>_>_>
               ::operator*(&local_a8);
      __n = pNVar2->node;
      if ((long)__n < 1) {
        __n = -__n;
      }
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&local_70,__n)
      ;
      *pvVar3 = *pvVar3 + 1;
      __gnu_cxx::
      __normal_iterator<const_NodePosition_*,_std::vector<NodePosition,_std::allocator<NodePosition>_>_>
      ::operator++(&local_a8);
    }
    __gnu_cxx::
    __normal_iterator<std::vector<NodePosition,_std::allocator<NodePosition>_>_*,_std::vector<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>_>
    ::operator++(&local_88);
  }
  __new_size = &(pRVar5->super_DistanceGraph).links;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_70);
  std::
  vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
  ::resize(this_00,(size_type)__new_size);
  local_c0 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1;
  while( true ) {
    this_01 = local_c0;
    pvVar4 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_70);
    if (pvVar4 <= this_01) break;
    std::
    vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
    ::operator[](&(pRVar5->super_DistanceGraph).links,(size_type)local_c0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              (&local_70,(size_type)local_c0);
    std::vector<Link,_std::allocator<Link>_>::reserve
              ((vector<Link,_std::allocator<Link>_> *)pRVar5,(size_type)__n_00);
    local_c0 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&(local_c0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                       ._M_impl.super__Vector_impl_data._M_start + 1);
  }
  local_c4 = 1;
  while( true ) {
    pRVar5 = (ReadThreadsGraph *)(long)local_c4;
    pRVar6 = (ReadThreadsGraph *)
             std::
             vector<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
             ::size((vector<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
                     *)(in_RSI + 6));
    if (pRVar6 <= pRVar5) break;
    std::
    vector<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
    ::operator[]((vector<std::vector<NodePosition,_std::allocator<NodePosition>_>,_std::allocator<std::vector<NodePosition,_std::allocator<NodePosition>_>_>_>
                  *)(in_RSI + 6),(long)local_c4);
    ReadThreadsGraph::add_thread
              ((ReadThreadsGraph *)__range2,(int64_t)__begin2._M_current,
               (vector<NodePosition,_std::allocator<NodePosition>_> *)__end2._M_current,np._7_1_,
               (int)np);
    local_c4 = local_c4 + 1;
  }
  local_19 = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(this_01);
  if ((local_19 & 1) == 0) {
    ReadThreadsGraph::~ReadThreadsGraph(pRVar5);
  }
  return in_RDI;
}

Assistant:

ReadThreadsGraph LongReadsRecruiter::rtg_from_threads(bool remove_duplicated, int min_thread_nodes) {
    ReadThreadsGraph rtg(sdg);
    std::vector<uint64_t> node_counts(sdg.nodes.size());
    for (auto const &t:read_threads) {
        for (auto const &np:t ) ++node_counts[llabs(np.node)];
    }
    rtg.links.resize(node_counts.size());
    for (uint64_t i=1;i<node_counts.size();++i) rtg.links[i].reserve(2*node_counts[i]);
    for (auto rid=1;rid<read_threads.size();++rid) {
        rtg.add_thread(rid,read_threads[rid],remove_duplicated,min_thread_nodes);
    }
    return rtg;
}